

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::OpenPopupEx(ImGuiID id)

{
  bool bVar1;
  uint *puVar2;
  ImGuiPopupRef *pIVar3;
  ImGuiID in_EDI;
  ImGuiPopupRef popup_ref;
  int current_stack_size;
  ImGuiWindow *parent_window;
  ImGuiContext *g;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  ImGuiPopupRef *in_stack_ffffffffffffffa0;
  ImVector<ImGuiPopupRef> *this;
  ImGuiID local_50 [2];
  undefined8 local_48;
  ImGuiWindow *local_40;
  int local_38;
  uint local_34;
  ImVec2 local_30;
  ImGuiPopupRef *local_28;
  int local_1c;
  ImGuiWindow *local_18;
  ImGuiContext *local_10;
  ImGuiID local_4;
  
  local_10 = GImGui;
  local_18 = GImGui->CurrentWindow;
  local_1c = (GImGui->BeginPopupStack).Size;
  local_4 = in_EDI;
  ImGuiPopupRef::ImGuiPopupRef(in_stack_ffffffffffffffa0);
  local_50[0] = local_4;
  local_48 = 0;
  local_40 = local_18;
  local_38 = local_10->FrameCount;
  puVar2 = ImVector<unsigned_int>::back(&local_18->IDStack);
  local_34 = *puVar2;
  local_30 = NavCalcPreferredRefPos();
  bVar1 = IsMousePosValid(&(local_10->IO).MousePos);
  if (bVar1) {
    this = (ImVector<ImGuiPopupRef> *)&(local_10->IO).MousePos;
  }
  else {
    this = (ImVector<ImGuiPopupRef> *)&local_30;
  }
  local_28 = *(ImGuiPopupRef **)this;
  if ((local_10->OpenPopupStack).Size < local_1c + 1) {
    ImVector<ImGuiPopupRef>::push_back
              (this,(ImGuiPopupRef *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  }
  else {
    pIVar3 = ImVector<ImGuiPopupRef>::operator[](&local_10->OpenPopupStack,local_1c);
    if ((pIVar3->PopupId == local_4) &&
       (pIVar3 = ImVector<ImGuiPopupRef>::operator[](&local_10->OpenPopupStack,local_1c),
       pIVar3->OpenFrameCount == local_10->FrameCount + -1)) {
      pIVar3 = ImVector<ImGuiPopupRef>::operator[](&local_10->OpenPopupStack,local_1c);
      pIVar3->OpenFrameCount = local_38;
    }
    else {
      ImVector<ImGuiPopupRef>::resize(this,in_stack_ffffffffffffff9c);
      pIVar3 = ImVector<ImGuiPopupRef>::operator[](&local_10->OpenPopupStack,local_1c);
      memcpy(pIVar3,local_50,0x30);
    }
  }
  return;
}

Assistant:

void ImGui::OpenPopupEx(ImGuiID id)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* parent_window = g.CurrentWindow;
    int current_stack_size = g.BeginPopupStack.Size;
    ImGuiPopupRef popup_ref; // Tagged as new ref as Window will be set back to NULL if we write this into OpenPopupStack.
    popup_ref.PopupId = id;
    popup_ref.Window = NULL;
    popup_ref.ParentWindow = parent_window;
    popup_ref.OpenFrameCount = g.FrameCount;
    popup_ref.OpenParentId = parent_window->IDStack.back();
    popup_ref.OpenPopupPos = NavCalcPreferredRefPos();
    popup_ref.OpenMousePos = IsMousePosValid(&g.IO.MousePos) ? g.IO.MousePos : popup_ref.OpenPopupPos;

    //IMGUI_DEBUG_LOG("OpenPopupEx(0x%08X)\n", g.FrameCount, id);
    if (g.OpenPopupStack.Size < current_stack_size + 1)
    {
        g.OpenPopupStack.push_back(popup_ref);
    }
    else
    {
        // Gently handle the user mistakenly calling OpenPopup() every frame. It is a programming mistake! However, if we were to run the regular code path, the ui
        // would become completely unusable because the popup will always be in hidden-while-calculating-size state _while_ claiming focus. Which would be a very confusing
        // situation for the programmer. Instead, we silently allow the popup to proceed, it will keep reappearing and the programming error will be more obvious to understand.
        if (g.OpenPopupStack[current_stack_size].PopupId == id && g.OpenPopupStack[current_stack_size].OpenFrameCount == g.FrameCount - 1)
        {
            g.OpenPopupStack[current_stack_size].OpenFrameCount = popup_ref.OpenFrameCount;
        }
        else
        {
            // Close child popups if any, then flag popup for open/reopen
            g.OpenPopupStack.resize(current_stack_size + 1);
            g.OpenPopupStack[current_stack_size] = popup_ref;
        }

        // When reopening a popup we first refocus its parent, otherwise if its parent is itself a popup it would get closed by ClosePopupsOverWindow().
        // This is equivalent to what ClosePopupToLevel() does.
        //if (g.OpenPopupStack[current_stack_size].PopupId == id)
        //    FocusWindow(parent_window);
    }
}